

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_ego_item(parser *p)

{
  uint32_t uVar1;
  wchar_t tval;
  wchar_t sval;
  parser_error pVar2;
  char *pcVar3;
  void *pvVar4;
  uint32_t *puVar5;
  object_kind *poVar6;
  
  pcVar3 = parser_getsym(p,"tval");
  tval = tval_find_idx(pcVar3);
  pcVar3 = parser_getsym(p,"sval");
  sval = lookup_sval(tval,pcVar3);
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else if (tval < L'\0') {
    pVar2 = PARSE_ERROR_UNRECOGNISED_TVAL;
  }
  else if (sval < L'\0') {
    pVar2 = PARSE_ERROR_UNRECOGNISED_SVAL;
  }
  else {
    puVar5 = (uint32_t *)mem_zalloc(0x10);
    poVar6 = lookup_kind(tval,sval);
    uVar1 = poVar6->kidx;
    *puVar5 = uVar1;
    *(undefined8 *)(puVar5 + 2) = *(undefined8 *)((long)pvVar4 + 0x200);
    *(uint32_t **)((long)pvVar4 + 0x200) = puVar5;
    pVar2 = PARSE_ERROR_INVALID_ITEM_NUMBER;
    if (uVar1 != 0) {
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_ego_item(struct parser *p) {
	struct poss_item *poss;
	int tval = tval_find_idx(parser_getsym(p, "tval"));
	int sval = lookup_sval(tval, parser_getsym(p, "sval"));
	struct ego_item *e = parser_priv(p);

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (tval < 0) {
		return PARSE_ERROR_UNRECOGNISED_TVAL;
	}
	if (sval < 0) {
		return PARSE_ERROR_UNRECOGNISED_SVAL;
	}
	poss = mem_zalloc(sizeof(struct poss_item));
	poss->kidx = lookup_kind(tval, sval)->kidx;
	poss->next = e->poss_items;
	e->poss_items = poss;
	return (poss->kidx <= 0) ?
		PARSE_ERROR_INVALID_ITEM_NUMBER : PARSE_ERROR_NONE;
}